

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

opj_bool tcd_init_v2(opj_tcd_v2_t *p_tcd,opj_image_t *p_image,opj_cp_v2_t *p_cp)

{
  uint uVar1;
  void *pvVar2;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  OPJ_UINT32 l_tile_comp_size;
  opj_bool local_4;
  
  *(long *)(in_RDI + 8) = in_RSI;
  *(long *)(in_RDI + 10) = in_RDX;
  pvVar2 = malloc(0x358);
  **(undefined8 **)(in_RDI + 6) = pvVar2;
  if (**(long **)(in_RDI + 6) == 0) {
    local_4 = 0;
  }
  else {
    memset((void *)**(undefined8 **)(in_RDI + 6),0,0x358);
    uVar1 = *(int *)(in_RSI + 0x10) * 0x38;
    pvVar2 = malloc((ulong)uVar1);
    *(void **)(**(long **)(in_RDI + 6) + 0x18) = pvVar2;
    if (*(long *)(**(long **)(in_RDI + 6) + 0x18) == 0) {
      local_4 = 0;
    }
    else {
      memset(*(void **)(**(long **)(in_RDI + 6) + 0x18),0,(ulong)uVar1);
      *(undefined4 *)(**(long **)(in_RDI + 6) + 0x10) = *(undefined4 *)(in_RSI + 0x10);
      *in_RDI = *(undefined4 *)(in_RDX + 0x70);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

opj_bool tcd_init_v2(  opj_tcd_v2_t *p_tcd,
					   opj_image_t * p_image,
					   opj_cp_v2_t * p_cp )
{
	OPJ_UINT32 l_tile_comp_size;

	p_tcd->image = p_image;
	p_tcd->cp = p_cp;

	p_tcd->tcd_image->tiles = (opj_tcd_tile_v2_t *) opj_malloc(sizeof(opj_tcd_tile_v2_t));
	if (! p_tcd->tcd_image->tiles) {
		return OPJ_FALSE;
	}
	memset(p_tcd->tcd_image->tiles,0, sizeof(opj_tcd_tile_v2_t));

	l_tile_comp_size = p_image->numcomps * sizeof(opj_tcd_tilecomp_v2_t);
	p_tcd->tcd_image->tiles->comps = (opj_tcd_tilecomp_v2_t *) opj_malloc(l_tile_comp_size);
	if (! p_tcd->tcd_image->tiles->comps ) {
		return OPJ_FALSE;
	}
	memset( p_tcd->tcd_image->tiles->comps , 0 , l_tile_comp_size);

	p_tcd->tcd_image->tiles->numcomps = p_image->numcomps;
	p_tcd->tp_pos = p_cp->m_specific_param.m_enc.m_tp_pos;

	return OPJ_TRUE;
}